

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O1

int richolu(double *A,int N,int stride,double *U22)

{
  long lVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  uint m;
  double dVar10;
  
  lVar3 = (long)stride;
  iVar8 = N + -1;
  pdVar9 = A + lVar3 + 1;
  while( true ) {
    dVar10 = *A;
    if (N == 1) {
      iVar8 = -1;
      if (0.0 < dVar10) {
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        *A = dVar10;
        iVar8 = 0;
      }
      return iVar8;
    }
    if (dVar10 < 0.0) break;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    *A = dVar10;
    if (1 < N) {
      uVar4 = 1;
      do {
        dVar2 = A[uVar4];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          A[uVar4] = dVar2 / dVar10;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
    }
    m = N - 1;
    mmult(A + 1,A + 1,U22,m,1,m);
    if (1 < N) {
      uVar4 = 0;
      pdVar5 = pdVar9;
      pdVar6 = U22;
      do {
        lVar7 = 0;
        do {
          dVar10 = pdVar5[lVar7];
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            pdVar5[lVar7] = dVar10 - pdVar6[lVar7];
          }
          lVar1 = uVar4 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar1 + 1 < (long)(int)m);
        uVar4 = uVar4 + 1;
        pdVar6 = pdVar6 + (long)iVar8 + 1;
        pdVar5 = pdVar5 + lVar3 + 1;
      } while (uVar4 != m);
    }
    A = A + lVar3 + 1;
    iVar8 = iVar8 + -1;
    pdVar9 = pdVar9 + lVar3 + 1;
    N = m;
  }
  return -1;
}

Assistant:

static int richolu(double *A,int N, int stride, double *U22) {
	int sc;
	int j,i,u,w;
	double u11;
	
	if (N == 1) {
		if (A[0] > 0) {
			A[0] = sqrt(A[0]);
			return 0;
		} else {
			return -1;
		}
	} else {
		if (A[0] < 0) {
			return -1;
		}
		u11 = sqrt(A[0]);
		A[0] = u11;
		for (j = 1; j < N;++j) {
			if (A[j] != 0) {
				A[j] /= u11;
			}
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1 + i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				if (A[j + u] != 0) {
					A[j + u] -= U22[j + w];
				}
			}
		}
		
		sc = richolu(A+stride+1,N-1,stride,U22);
		if (sc == -1) {
			return -1;
		}
		
	}
	
	return sc;
	
}